

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::setFlags(QTreeWidgetItem *this,ItemFlags flags)

{
  byte bVar1;
  QTreeWidgetItem *t;
  Int IVar2;
  bool bVar3;
  value_type pQVar4;
  uint uVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QTreeWidgetItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
          & 0x20;
  IVar2 = (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
          super_QFlagsStorage<Qt::ItemFlag>.i;
  bVar3 = SUB41(uVar5 >> 5,0);
  bVar1 = this->d->field_0x20;
  this->d->field_0x20 = bVar1 & 0xfe | uVar5 == 0;
  if (((uVar5 != 0) && (this->par != (QTreeWidgetItem *)0x0)) &&
     (((this->par->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
       super_QFlagsStorage<Qt::ItemFlag>.i & 0x20) == 0)) {
    flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorageHelper<Qt::ItemFlag,_4>)
         (QFlagsStorageHelper<Qt::ItemFlag,_4>)
         ((uint)flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
         & 0xffffffdf);
  }
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  if (((IVar2 & 0x20) == 0) == bVar3 && ((bVar3 ^ bVar1) & 1) == 0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QTreeWidgetItem **)0x0;
    local_58.size = 0;
    QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_58,this);
    while (local_58.size != 0) {
      pQVar4 = QList<QTreeWidgetItem_*>::takeLast((QList<QTreeWidgetItem_*> *)&local_58);
      for (uVar6 = 0; uVar6 < (ulong)(pQVar4->children).d.size; uVar6 = uVar6 + 1) {
        t = (pQVar4->children).d.ptr[uVar6];
        if ((t->d->field_0x20 & 1) == 0) {
          QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)&local_58,t);
          (t->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
          super_QFlagsStorage<Qt::ItemFlag>.i =
               (t->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
               super_QFlagsStorage<Qt::ItemFlag>.i & 0xffffffdf | uVar5;
          itemChanged(t);
        }
      }
    }
    QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(&local_58);
  }
  itemChanged(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setFlags(Qt::ItemFlags flags)
{
    const bool enable = (flags & Qt::ItemIsEnabled);
    const bool changedState = bool(itemFlags & Qt::ItemIsEnabled) != enable;
    const bool changedExplicit = d->disabled != !enable;

    d->disabled = !enable;

    if (enable && par && !(par->itemFlags & Qt::ItemIsEnabled)) // inherit from parent
        itemFlags = flags & ~Qt::ItemIsEnabled;
    else // this item is explicitly disabled or has no parent
        itemFlags = flags;

    if (changedState && changedExplicit) { // if the propagate the change to the children
        QStack<QTreeWidgetItem*> parents;
        parents.push(this);
        while (!parents.isEmpty()) {
            QTreeWidgetItem *parent = parents.pop();
            for (int i = 0; i < parent->children.size(); ++i) {
                QTreeWidgetItem *child = parent->children.at(i);
                if (!child->d->disabled) { // if not explicitly disabled
                    parents.push(child);
                    if (enable)
                        child->itemFlags = child->itemFlags | Qt::ItemIsEnabled;
                    else
                        child->itemFlags = child->itemFlags & ~Qt::ItemIsEnabled;
                    child->itemChanged(); // ### we may want to optimize this
                }
            }
        }
    }
    itemChanged();
}